

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::objectivec::FieldName_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,FieldDescriptor *field)

{
  string *__return_storage_ptr___00;
  bool bVar1;
  allocator local_b9;
  string local_b8;
  allocator local_91;
  string local_90;
  undefined1 local_60 [8];
  string result;
  string *name;
  FieldDescriptor *field_local;
  
  __return_storage_ptr___00 = (string *)((long)&result.field_2 + 8);
  (anonymous_namespace)::NameFromFieldDescriptor_abi_cxx11_
            (__return_storage_ptr___00,(_anonymous_namespace_ *)this,field);
  anon_unknown_0::UnderscoresToCamelCase((string *)local_60,__return_storage_ptr___00,false);
  bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)this);
  if ((!bVar1) || (bVar1 = FieldDescriptor::is_map((FieldDescriptor *)this), bVar1)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_90,"Array",&local_91);
    bVar1 = HasSuffixString((string *)local_60,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    if (bVar1) {
      std::__cxx11::string::operator+=((string *)local_60,"_p");
    }
  }
  else {
    std::__cxx11::string::operator+=((string *)local_60,"Array");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,"_p",&local_b9);
  anon_unknown_0::SanitizeNameForObjC
            (__return_storage_ptr__,(string *)local_60,&local_b8,(string *)0x0);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(result.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

string FieldName(const FieldDescriptor* field) {
  const string& name = NameFromFieldDescriptor(field);
  string result = UnderscoresToCamelCase(name, false);
  if (field->is_repeated() && !field->is_map()) {
    // Add "Array" before do check for reserved worlds.
    result += "Array";
  } else {
    // If it wasn't repeated, but ends in "Array", force on the _p suffix.
    if (HasSuffixString(result, "Array")) {
      result += "_p";
    }
  }
  return SanitizeNameForObjC(result, "_p", NULL);
}